

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O1

void __thiscall gui::DialogBox::draw(DialogBox *this)

{
  RenderTarget *in_RSI;
  undefined1 in_stack_00000008 [104];
  
  draw((DialogBox *)
       &this[-1].optionButtons_.
        super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage,in_RSI,(RenderStates)in_stack_00000008);
  return;
}

Assistant:

void DialogBox::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    style_->rect_.setSize(size_);
    target.draw(style_->rect_, states);
    float outlineThickness = style_->rect_.getOutlineThickness();
    style_->titleBar_.setPosition(-outlineThickness, -outlineThickness);
    style_->titleBar_.setSize({size_.x + outlineThickness * 2.0f, style_->titleBarHeight_});
    target.draw(style_->titleBar_, states);

    for (const auto& child : getChildren()) {
        target.draw(*child, states);
    }
}